

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_00;
  bool bVar2;
  char *pcVar3;
  reference __k;
  mapped_type *__x;
  reference dependence;
  size_type sVar4;
  size_type sVar5;
  size_type sVar6;
  ostream *poVar7;
  pair<std::_Rb_tree_const_iterator<cmCPackIFWPackage::DependenceStruct_*>,_bool> pVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  char *local_410;
  char *option_3;
  undefined1 local_3e8 [8];
  ostringstream cmCPackLog_msg;
  allocator local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  char *local_228;
  char *option_2;
  undefined1 local_218;
  mapped_type *local_210;
  mapped_type *local_208;
  DependenceStruct *depRef;
  undefined1 local_1f8 [7];
  bool hasDep;
  DependenceStruct dep;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  iterator dit_1;
  string local_198;
  undefined1 local_178 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  char *option_1;
  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
  local_128;
  cmCPackComponent **local_120;
  __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
  local_118;
  iterator dit;
  char *option;
  string local_e0;
  char *local_c0;
  char *optPACKAGE_VERSION;
  char *local_98;
  char *optVERSION;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string prefix;
  cmCPackComponent *component_local;
  cmCPackIFWPackage *this_local;
  
  if (component == (cmCPackComponent *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    prefix.field_2._8_8_ = component;
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_80,(string *)prefix.field_2._8_8_);
    std::operator+(&local_60,"CPACK_IFW_COMPONENT_",&local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"_");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::operator=((string *)this,(string *)(prefix.field_2._8_8_ + 0x20));
    std::__cxx11::string::operator=
              ((string *)&this->Description,(string *)(prefix.field_2._8_8_ + 0x50));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &optPACKAGE_VERSION,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "VERSION");
    pcVar3 = GetOption(this,(string *)&optPACKAGE_VERSION);
    std::__cxx11::string::~string((string *)&optPACKAGE_VERSION);
    local_98 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"CPACK_PACKAGE_VERSION",(allocator *)((long)&option + 7));
      pcVar3 = GetOption(this,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 7));
      local_c0 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::operator=((string *)&this->Version,"1.0.0");
      }
      else {
        std::__cxx11::string::operator=((string *)&this->Version,pcVar3);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Version,pcVar3);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dit,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "SCRIPT");
    pcVar3 = GetOption(this,(string *)&dit);
    std::__cxx11::string::~string((string *)&dit);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->Script,pcVar3);
    }
    bVar2 = std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::empty
                      ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                       (prefix.field_2._8_8_ + 0xa8));
    if (!bVar2) {
      __gnu_cxx::
      __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
      ::__normal_iterator(&local_118);
      local_120 = (cmCPackComponent **)
                  std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::begin
                            ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                             (prefix.field_2._8_8_ + 0xa8));
      local_118._M_current = local_120;
      while( true ) {
        local_128._M_current =
             (cmCPackComponent **)
             std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::end
                       ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                        (prefix.field_2._8_8_ + 0xa8));
        bVar2 = __gnu_cxx::operator!=(&local_118,&local_128);
        if (!bVar2) break;
        pcVar1 = this->Generator;
        __k = __gnu_cxx::
              __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
              ::operator*(&local_118);
        __x = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&pcVar1->ComponentPackages,__k);
        std::
        set<cmCPackIFWPackage_*,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
        ::insert(&this->Dependencies,__x);
        __gnu_cxx::
        __normal_iterator<cmCPackComponent_**,_std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>_>
        ::operator++(&local_118);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &deps.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "DEPENDS");
    pcVar3 = GetOption(this,(string *)
                            &deps.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &deps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_198,pcVar3,(allocator *)((long)&dit_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_198,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178,false);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dit_1._M_current + 7));
      local_1a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178);
      while( true ) {
        dep.Compare.Value.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_178);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1a8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&dep.Compare.Value.field_2 + 8));
        if (!bVar2) break;
        dependence = __gnu_cxx::
                     __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_1a8);
        DependenceStruct::DependenceStruct((DependenceStruct *)local_1f8,dependence);
        sVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::count(&this->Generator->Packages,(key_type *)local_1f8);
        if (sVar4 == 0) {
          sVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                  ::count(&this->Generator->DependentPackages,(key_type *)local_1f8);
          depRef._7_1_ = sVar5 != 0;
          local_208 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
                      ::operator[](&this->Generator->DependentPackages,(key_type *)local_1f8);
          if ((depRef._7_1_ & 1) == 0) {
            DependenceStruct::operator=(local_208,(DependenceStruct *)local_1f8);
          }
          local_210 = local_208;
          pVar8 = std::
                  set<cmCPackIFWPackage::DependenceStruct_*,_std::less<cmCPackIFWPackage::DependenceStruct_*>,_std::allocator<cmCPackIFWPackage::DependenceStruct_*>_>
                  ::insert(&this->AlienDependencies,&local_210);
          option_2 = (char *)pVar8.first._M_node;
          local_218 = pVar8.second;
        }
        DependenceStruct::~DependenceStruct((DependenceStruct *)local_1f8);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_178);
    }
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "LICENSES");
    pcVar3 = GetOption(this,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    local_228 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->Licenses);
      pcVar3 = local_228;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_268,pcVar3,&local_269);
      cmSystemTools::ExpandListArgument(&local_268,&this->Licenses,false);
      std::__cxx11::string::~string((string *)&local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->Licenses);
      if ((sVar6 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
        poVar7 = std::operator<<((ostream *)local_3e8,(string *)local_40);
        poVar7 = std::operator<<(poVar7,"LICENSES");
        poVar7 = std::operator<<(poVar7," should contain pairs of <display_name> and <file_path>.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        if (this->Generator != (cmCPackIFWGenerator *)0x0) {
          this_00 = (this->Generator->super_cmCPackGenerator).Logger;
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(this_00,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0x134,pcVar3);
          std::__cxx11::string::~string((string *)&option_3);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->Licenses);
      }
    }
    std::operator+(&local_430,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   "PRIORITY");
    pcVar3 = GetOption(this,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    local_410 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->SortingPriority,pcVar3);
    }
    pcVar3 = "true";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 2 & 1) != 0) {
      pcVar3 = "false";
    }
    std::__cxx11::string::operator=((string *)&this->Default,pcVar3);
    pcVar3 = "";
    if ((*(uint *)(prefix.field_2._8_8_ + 0x48) >> 1 & 1) != 0) {
      pcVar3 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->Virtual,pcVar3);
    pcVar3 = "false";
    if ((*(byte *)(prefix.field_2._8_8_ + 0x48) & 1) != 0) {
      pcVar3 = "true";
    }
    std::__cxx11::string::operator=((string *)&this->ForcedInstallation,pcVar3);
    this_local._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent *component)
{
  if(!component) return 0;

  // Restore defaul configuration
  DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_"
    + cmsys::SystemTools::UpperCase(component->Name)
    + "_";

  // Display name
  DisplayName = component->DisplayName;

  // Description
  Description = component->Description;

  // Version
  if(const char* optVERSION = GetOption(prefix + "VERSION"))
    {
    Version = optVERSION;
    }
  else if(const char* optPACKAGE_VERSION =
          GetOption("CPACK_PACKAGE_VERSION"))
    {
    Version = optPACKAGE_VERSION;
    }
  else
    {
    Version = "1.0.0";
    }

  // Script
  if (const char* option = GetOption(prefix + "SCRIPT"))
    {
    Script = option;
    }

  // CMake dependencies
  if (!component->Dependencies.empty())
    {
    std::vector<cmCPackComponent*>::iterator dit;
    for(dit = component->Dependencies.begin();
        dit != component->Dependencies.end();
        ++dit)
      {
      Dependencies.insert(Generator->ComponentPackages[*dit]);
      }
    }

  // QtIFW dependencies
  if(const char* option = this->GetOption(prefix + "DEPENDS"))
    {
    std::vector<std::string> deps;
    cmSystemTools::ExpandListArgument(option,
                                      deps);
    for(std::vector<std::string>::iterator
          dit = deps.begin(); dit != deps.end(); ++dit)
      {
      DependenceStruct dep(*dit);
      if (!Generator->Packages.count(dep.Name))
        {
        bool hasDep = Generator->DependentPackages.count(dep.Name) > 0;
        DependenceStruct &depRef =
          Generator->DependentPackages[dep.Name];
        if(!hasDep)
          {
          depRef = dep;
          }
        AlienDependencies.insert(&depRef);
        }
      }
    }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES"))
    {
    Licenses.clear();
    cmSystemTools::ExpandListArgument( option, Licenses );
    if ( Licenses.size() % 2 != 0 )
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, prefix << "LICENSES"
        << " should contain pairs of <display_name> and <file_path>."
        << std::endl);
      Licenses.clear();
      }
    }

  // Priority
  if(const char* option = this->GetOption(prefix + "PRIORITY"))
    {
    SortingPriority = option;
    }

  // Default
  Default = component->IsDisabledByDefault ? "false" : "true";

  // Virtual
  Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  ForcedInstallation = component->IsRequired ? "true" : "false";

  return 1;
}